

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_price_field_Test::
~PriceUpdateDecoderTest_test_decode_price_field_Test
          (PriceUpdateDecoderTest_test_decode_price_field_Test *this)

{
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_002982a8;
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&(this->super_PriceUpdateDecoderTest).buffer);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_price_field)
{
    double price = 43.45664;
    uint64_t priceTimesMillion = 43456640L;
    Varint::WriteU64(buffer, priceTimesMillion);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::DOUBLE, price_field.GetType());
    EXPECT_EQ(price, price_field.GetDouble());
}